

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O2

id __thiscall
jessilib::impl::parser_manager::register_parser
          (parser_manager *this,shared_ptr<jessilib::parser> *in_parser,string *in_format,
          bool in_force)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
  *this_00;
  iterator __it;
  id iVar1;
  id parser_id;
  undefined1 local_50 [40];
  
  std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)this);
  this_00 = &this->m_parsers;
  __it = std::
         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find(&this_00->_M_h,in_format);
  if (__it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    if (!in_force) {
      iVar1 = 0;
      goto LAB_0018c558;
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::erase(&this_00->_M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>,_true>
            ._M_cur);
    registration::registration((registration *)local_50,in_format);
    std::
    _Rb_tree<jessilib::impl::parser_manager::registration,_jessilib::impl::parser_manager::registration,_std::_Identity<jessilib::impl::parser_manager::registration>,_std::less<jessilib::impl::parser_manager::registration>,_std::allocator<jessilib::impl::parser_manager::registration>_>
    ::erase(&(this->m_registrations)._M_t,(key_type *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  local_50._0_8_ = this->m_last_id + 1;
  this->m_last_id = local_50._0_8_;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<jessilib::parser>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<jessilib::parser>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string_const&,std::shared_ptr<jessilib::parser>&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<jessilib::parser>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<jessilib::parser>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this_00,in_format,in_parser);
  std::
  _Rb_tree<jessilib::impl::parser_manager::registration,jessilib::impl::parser_manager::registration,std::_Identity<jessilib::impl::parser_manager::registration>,std::less<jessilib::impl::parser_manager::registration>,std::allocator<jessilib::impl::parser_manager::registration>>
  ::_M_emplace_unique<unsigned_long&,std::__cxx11::string_const&>
            ((_Rb_tree<jessilib::impl::parser_manager::registration,jessilib::impl::parser_manager::registration,std::_Identity<jessilib::impl::parser_manager::registration>,std::less<jessilib::impl::parser_manager::registration>,std::allocator<jessilib::impl::parser_manager::registration>>
              *)&this->m_registrations,(unsigned_long *)local_50,in_format);
  iVar1 = local_50._0_8_;
LAB_0018c558:
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return iVar1;
}

Assistant:

parser_manager::id parser_manager::register_parser(std::shared_ptr<parser> in_parser, const std::string& in_format, bool in_force) {
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	// Check for any existing parser
	auto itr = m_parsers.find(in_format);
	if (itr != m_parsers.end()) {
		// A parser already exists; return or replace
		if (!in_force) {
			return bad_id;
		}

		// Remove existing parser and registration
		m_parsers.erase(itr);
		m_registrations.erase(registration{ in_format });
	}

	// Register our new parser
	id parser_id = ++m_last_id;
	m_parsers.emplace(in_format, in_parser);
	m_registrations.emplace(parser_id, in_format);

	// Our parser is registered; return the parser ID we just registered
	return parser_id;
}